

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall libtorrent::peer_unsnubbed_alert::~peer_unsnubbed_alert(peer_unsnubbed_alert *this)

{
  torrent_alert::~torrent_alert((torrent_alert *)this);
  operator_delete(this,0x60);
  return;
}

Assistant:

struct TORRENT_EXPORT peer_unsnubbed_alert final : peer_alert
	{
		// internal
		TORRENT_UNEXPORT peer_unsnubbed_alert(aux::stack_allocator& alloc, torrent_handle h
			, tcp::endpoint const& ep, peer_id const& peer_id);

		TORRENT_DEFINE_ALERT(peer_unsnubbed_alert, 20)

		static inline constexpr alert_category_t static_category = alert_category::peer;
		std::string message() const override;
	}